

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

void thread_proc(void)

{
  IBackend *pIVar1;
  pointer pcVar2;
  pointer puVar3;
  log_entry *plVar4;
  long lVar5;
  unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_> *backend;
  pointer puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  
  do {
    do {
      if (cancel != false) {
        return;
      }
      plVar4 = log_queue::pop_top(queue);
      puVar3 = backends.
               super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (plVar4 == (log_entry *)0x0);
    if (backends.
        super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        backends.
        super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar6 = backends.
               super__Vector_base<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>,_std::allocator<std::unique_ptr<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        lVar5 = 0x10;
        switch(plVar4->level) {
        case verbose:
        case error:
          break;
        case info:
          lVar5 = 0x18;
          break;
        case warning:
          lVar5 = 0x20;
          break;
        default:
          goto switchD_001c2d7d_default;
        }
        pIVar1 = (puVar6->_M_t).
                 super___uniq_ptr_impl<f8n::debug::IBackend,_std::default_delete<f8n::debug::IBackend>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_f8n::debug::IBackend_*,_std::default_delete<f8n::debug::IBackend>_>
                 .super__Head_base<0UL,_f8n::debug::IBackend_*,_false>._M_head_impl;
        (**(code **)((long)pIVar1->_vptr_IBackend + lVar5))(pIVar1,&plVar4->tag,&plVar4->message);
switchD_001c2d7d_default:
        puVar6 = puVar6 + 1;
      } while (puVar6 != puVar3);
    }
    pcVar2 = (plVar4->message)._M_dataplus._M_p;
    paVar7 = &(plVar4->message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar7) {
      operator_delete(pcVar2,paVar7->_M_allocated_capacity + 1);
    }
    pcVar2 = (plVar4->tag)._M_dataplus._M_p;
    paVar7 = &(plVar4->tag).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar7) {
      operator_delete(pcVar2,paVar7->_M_allocated_capacity + 1);
    }
    operator_delete(plVar4,0x48);
  } while( true );
}

Assistant:

static void thread_proc() {
    try {
        while (!cancel) {
            log_queue::log_entry* entry = queue->pop_top();
            if (entry) {
                for (auto& backend : backends) {
                    switch (entry->level) {
                        case debug_level::verbose:
                            backend->verbose(entry->tag, entry->message);
                            break;
                        case debug_level::info:
                            backend->info(entry->tag, entry->message);
                            break;
                        case debug_level::warning:
                            backend->warning(entry->tag, entry->message);
                            break;
                        case debug_level::error:
                            backend->verbose(entry->tag, entry->message);
                            break;
                    }
                }
                delete entry;
            }
        }
    }
    catch (log_queue::stopped_exception&) {
    }
}